

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::Function::RegisterBlock(Function *this,uint32_t block_id,bool is_definition)

{
  pointer ppVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  pVar2;
  _Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
  local_1a0 [2];
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false> local_190;
  undefined1 local_188;
  BasicBlock local_180;
  pair<const_unsigned_int,_spvtools::val::BasicBlock> local_e0;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>,_bool>
  local_38;
  byte local_21;
  bool success;
  iterator inserted_block;
  bool is_definition_local;
  uint32_t block_id_local;
  Function *this_local;
  
  inserted_block.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>._M_cur.
  _3_1_ = is_definition;
  inserted_block.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>._M_cur.
  _4_4_ = block_id;
  if (this->declaration_type_ != kFunctionDeclDefinition) {
    __assert_fail("declaration_type_ == FunctionDecl::kFunctionDeclDefinition && \"RegisterBlocks can only be called after declaration_type_ is defined\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                  ,0x79,"spv_result_t spvtools::val::Function::RegisterBlock(uint32_t, bool)");
  }
  std::__detail::
  _Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>::
  _Node_iterator((_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
                  *)&stack0xffffffffffffffe0);
  local_21 = 0;
  BasicBlock::BasicBlock
            (&local_180,
             inserted_block.
             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
             ._M_cur._4_4_);
  std::pair<const_unsigned_int,_spvtools::val::BasicBlock>::
  pair<unsigned_int_&,_spvtools::val::BasicBlock,_true>
            (&local_e0,
             (uint *)((long)&inserted_block.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                             ._M_cur + 4),&local_180);
  pVar2 = std::
          unordered_map<unsigned_int,_spvtools::val::BasicBlock,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>_>
          ::insert(&this->blocks_,&local_e0);
  local_190._M_cur =
       (__node_type *)
       pVar2.first.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>.
       _M_cur;
  local_188 = pVar2.second;
  local_38.first.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>._M_cur
       = (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>)
         (_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>)
         local_190._M_cur;
  local_38.second = (bool)local_188;
  std::
  tie<std::__detail::_Node_iterator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>,false,false>,bool>
            (local_1a0,(bool *)&stack0xffffffffffffffe0);
  std::
  tuple<std::__detail::_Node_iterator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>,false,false>&,bool&>
  ::operator=((tuple<std::__detail::_Node_iterator<std::pair<unsigned_int_const,spvtools::val::BasicBlock>,false,false>&,bool&>
               *)local_1a0,&local_38);
  std::pair<const_unsigned_int,_spvtools::val::BasicBlock>::~pair(&local_e0);
  BasicBlock::~BasicBlock(&local_180);
  if ((inserted_block.
       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>.
       _M_cur._3_1_ & 1) == 0) {
    if ((local_21 & 1) != 0) {
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert(&this->undefined_blocks_,
               (value_type *)
               ((long)&inserted_block.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                       ._M_cur + 4));
    }
  }
  else {
    if (this->current_block_ != (BasicBlock *)0x0) {
      __assert_fail("current_block_ == nullptr && \"Register Block can only be called when parsing a binary outside of \" \"a BasicBlock\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/function.cpp"
                    ,0x82,"spv_result_t spvtools::val::Function::RegisterBlock(uint32_t, bool)");
    }
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&this->undefined_blocks_,
            (key_type *)
            ((long)&inserted_block.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false>
                    ._M_cur + 4));
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_false,_false>
                           *)&stack0xffffffffffffffe0);
    this->current_block_ = &ppVar1->second;
    std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
    push_back(&this->ordered_blocks_,&this->current_block_);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Function::RegisterBlock(uint32_t block_id, bool is_definition) {
  assert(
      declaration_type_ == FunctionDecl::kFunctionDeclDefinition &&
      "RegisterBlocks can only be called after declaration_type_ is defined");

  std::unordered_map<uint32_t, BasicBlock>::iterator inserted_block;
  bool success = false;
  tie(inserted_block, success) =
      blocks_.insert({block_id, BasicBlock(block_id)});
  if (is_definition) {  // new block definition
    assert(current_block_ == nullptr &&
           "Register Block can only be called when parsing a binary outside of "
           "a BasicBlock");

    undefined_blocks_.erase(block_id);
    current_block_ = &inserted_block->second;
    ordered_blocks_.push_back(current_block_);
  } else if (success) {  // Block doesn't exist but this is not a definition
    undefined_blocks_.insert(block_id);
  }

  return SPV_SUCCESS;
}